

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O3

void verify_basic(archive *a,int seek_checks)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  int iVar4;
  char *pcVar5;
  time_t tVar6;
  la_int64_t lVar7;
  la_ssize_t lVar8;
  archive_entry *ae;
  int64_t o;
  size_t s;
  void *pv;
  char *buff [128];
  archive_entry *local_460;
  int local_454;
  la_int64_t local_450;
  int local_448 [2];
  void *local_440;
  undefined8 local_438;
  undefined7 uStack_430;
  undefined4 uStack_429;
  
  iVar1 = archive_read_next_header(a,&local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'o',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_format_name(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'p',"ZIP 1.0 (uncompressed)","\"ZIP 1.0 (uncompressed)\"",pcVar5,
             "archive_format_name(a)",(void *)0x0,L'\0');
  pcVar5 = archive_entry_pathname(local_460);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'q',"dir/","\"dir/\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_mtime(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'r',0x464f5519,"1179604249",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_size(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L's',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  local_454 = seek_checks;
  if (seek_checks != 0) {
    mVar2 = archive_entry_mode(local_460);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'u',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  wVar3 = archive_entry_is_encrypted(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'v',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'w',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_data_block(a,&local_440,(size_t *)local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'y',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_data_block(a, &pv, &s, &o)",a)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'z',(long)local_448[0],"(int)s",0,"0",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_format_name(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'}',"ZIP 2.0 (deflation)","\"ZIP 2.0 (deflation)\"",pcVar5,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar5 = archive_entry_pathname(local_460);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'~',"file1","\"file1\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_mtime(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x7f',0x464f5541,"1179604289",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  iVar1 = local_454;
  if (local_454 != 0) {
    mVar2 = archive_entry_mode(local_460);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x81',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  lVar7 = archive_entry_size(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x82',0x12,"18",lVar7,"archive_entry_size(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x83',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar4 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x84',(long)iVar4,"archive_read_has_encrypted_entries(a)",0,"0",a);
  failure("archive_read_data() returns number of bytes read");
  pcVar5 = archive_zlib_version();
  lVar8 = archive_read_data(a,&local_438,0x13);
  if (pcVar5 == (char *)0x0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x8a',-0x19,"ARCHIVE_FAILED",lVar8,"archive_read_data(a, buff, 19)",
                        (void *)0x0);
    pcVar5 = archive_error_string(a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'\x8c',pcVar5,"archive_error_string(a)",
               "Unsupported ZIP compression method (8: deflation)",
               "\"Unsupported ZIP compression method (8: deflation)\"",(void *)0x0,L'\0');
    iVar4 = archive_errno(a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                     ,L'\x8d',(uint)(iVar4 != 0),"archive_errno(a) != 0",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x87',0x12,"18",lVar8,"archive_read_data(a, buff, 19)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x88',&local_438,"buff","hello\nhello\nhello\n",
                        "\"hello\\nhello\\nhello\\n\"",0x12,"18",(void *)0x0);
  }
  iVar4 = archive_read_next_header(a,&local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x90',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_format_name(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'\x91',"ZIP 2.0 (deflation)","\"ZIP 2.0 (deflation)\"",pcVar5,
             "archive_format_name(a)",(void *)0x0,L'\0');
  pcVar5 = archive_entry_pathname(local_460);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'\x92',"file2","\"file2\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar6 = archive_entry_mtime(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x93',0x464f5bac,"1179605932",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x94',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar4 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x95',(long)iVar4,"archive_read_has_encrypted_entries(a)",0,"0",a);
  if (iVar1 != 0) {
    mVar2 = archive_entry_mode(local_460);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x97',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  wVar3 = archive_entry_size_is_set(local_460);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'\x99',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  lVar7 = archive_entry_size(local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'\x9a',0x12,"18",lVar7,"archive_entry_size(ae)",(void *)0x0);
  pcVar5 = archive_zlib_version();
  if (pcVar5 == (char *)0x0) {
    lVar8 = archive_read_data(a,&local_438,0x13);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'¡',-0x19,"ARCHIVE_FAILED",lVar8,"archive_read_data(a, buff, 19)",
                        (void *)0x0);
    pcVar5 = archive_error_string(a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'£',pcVar5,"archive_error_string(a)",
               "Unsupported ZIP compression method (8: deflation)",
               "\"Unsupported ZIP compression method (8: deflation)\"",(void *)0x0,L'\0');
    iVar1 = archive_errno(a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                     ,L'¤',(uint)(iVar1 != 0),"archive_errno(a) != 0",(void *)0x0);
  }
  else {
    failure("file2 has a bad CRC, so read should fail and not change buff");
    local_438 = 0x6161616161616161;
    uStack_430 = 0x61616161616161;
    uStack_429 = 0x61616161;
    lVar8 = archive_read_data(a,&local_438,0x13);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x9e',-0x19,"ARCHIVE_FAILED",lVar8,"archive_read_data(a, buff, 19)",
                        (void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'\x9f',&local_438,"buff","aaaaaaaaaaaaaaaaaaa","\"aaaaaaaaaaaaaaaaaaa\"",
                        0x13,"19",(void *)0x0);
  }
  iVar1 = archive_read_next_header(a,&local_460);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'¦',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  pcVar5 = archive_format_name(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'§',"ZIP 2.0 (deflation)","\"ZIP 2.0 (deflation)\"",pcVar5,"archive_format_name(a)",
             (void *)0x0,L'\0');
  failure("the archive file has three files");
  iVar1 = archive_file_count(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ª',3,"3",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code(a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'«',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
  iVar1 = archive_format(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'¬',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'®',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
verify_basic(struct archive *a, int seek_checks)
{
	struct archive_entry *ae;
	char *buff[128];
	const void *pv;
	size_t s;
	int64_t o;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 1.0 (uncompressed)", archive_format_name(a));
	assertEqualString("dir/", archive_entry_pathname(ae));
	assertEqualInt(1179604249, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_size(ae));
	if (seek_checks)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt((int)s, 0);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 2.0 (deflation)", archive_format_name(a));
	assertEqualString("file1", archive_entry_pathname(ae));
	assertEqualInt(1179604289, archive_entry_mtime(ae));
	if (seek_checks)
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(18, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	failure("archive_read_data() returns number of bytes read");
	if (archive_zlib_version() != NULL) {
		assertEqualInt(18, archive_read_data(a, buff, 19));
		assertEqualMem(buff, "hello\nhello\nhello\n", 18);
	} else {
		assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, 19));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (8: deflation)");
		assert(archive_errno(a) != 0);
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 2.0 (deflation)", archive_format_name(a));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(1179605932, archive_entry_mtime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	if (seek_checks) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(18, archive_entry_size(ae));
	if (archive_zlib_version() != NULL) {
		failure("file2 has a bad CRC, so read should fail and not change buff");
		memset(buff, 'a', 19);
		assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, 19));
		assertEqualMem(buff, "aaaaaaaaaaaaaaaaaaa", 19);
	} else {
		assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, 19));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (8: deflation)");
		assert(archive_errno(a) != 0);
	}
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 2.0 (deflation)", archive_format_name(a));
	/* Verify the number of files read. */
	failure("the archive file has three files");
	assertEqualInt(3, archive_file_count(a));
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}